

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

char * __thiscall
icu_63::StringEnumeration::next(StringEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  UnicodeString *s;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  StringEnumeration *this_local;
  
  iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,status);
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && ((UnicodeString *)CONCAT44(extraout_var,iVar2) != (UnicodeString *)0x0)) {
    UnicodeString::operator=(&this->unistr,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    iVar3 = UnicodeString::length(&this->unistr);
    ensureCharsCapacity(this,iVar3 + 1,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      if (resultLength != (int32_t *)0x0) {
        iVar3 = UnicodeString::length(&this->unistr);
        *resultLength = iVar3;
      }
      UnicodeString::extract(&this->unistr,0,0x7fffffff,this->chars,this->charsCapacity,kInvariant);
      return this->chars;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
StringEnumeration::next(int32_t *resultLength, UErrorCode &status) {
    const UnicodeString *s=snext(status);
    if(U_SUCCESS(status) && s!=NULL) {
        unistr=*s;
        ensureCharsCapacity(unistr.length()+1, status);
        if(U_SUCCESS(status)) {
            if(resultLength!=NULL) {
                *resultLength=unistr.length();
            }
            unistr.extract(0, INT32_MAX, chars, charsCapacity, US_INV);
            return chars;
        }
    }

    return NULL;
}